

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O2

void __thiscall trng::xoshiro256plus::jump(xoshiro256plus *this,unsigned_long_long s)

{
  int j_1;
  long lVar1;
  int j;
  unsigned_long_long in_RCX;
  ulong uVar2;
  result_type rVar3;
  uint i;
  uint uVar4;
  long lVar5;
  int i_1;
  ulong uVar6;
  anon_class_16_2_94731e0a f;
  vector<trng::GF2,_256UL> v0;
  vector<trng::GF2,_256UL> v1;
  matrix<trng::GF2,_256UL> M;
  xoshiro256plus local_a8;
  status_type local_80;
  _Vector_base<trng::GF2,_std::allocator<trng::GF2>_> local_60;
  _Vector_base<trng::GF2,_std::allocator<trng::GF2>_> local_48;
  
  if (s < 0x10) {
    for (uVar4 = 0; uVar4 < (uint)s; uVar4 = uVar4 + 1) {
      step(this);
    }
  }
  else {
    matrix<trng::GF2,_256UL>::matrix((matrix<trng::GF2,_256UL> *)&local_60);
    for (uVar6 = 0; uVar6 != 0x100; uVar6 = uVar6 + 1) {
      xoshiro256plus(&local_a8);
      status_type::status_type(&local_80,uVar6 & 0xffffffff);
      local_a8.S.r[1] = local_80.r[2] ^ local_80.r[0] ^ local_80.r[1];
      uVar2 = local_80.r[1] ^ local_80.r[3];
      local_a8.S.r[0] = local_80.r[0] ^ uVar2;
      local_a8.S.r[2] = local_80.r[2] ^ local_80.r[0] ^ local_80.r[1] << 0x11;
      local_a8.S.r[3] = uVar2 << 0x2d | uVar2 >> 0x13;
      status_type::to_vector((vector<trng::GF2,_256UL> *)&local_80,&local_a8.S);
      uVar2 = uVar6;
      for (in_RCX = 0; in_RCX != 0x100; in_RCX = in_RCX + 1) {
        local_60._M_impl.super__Vector_impl_data._M_start[uVar2].value =
             *(uint8_t *)(local_80.r[0] + in_RCX);
        uVar2 = uVar2 + 0x100;
      }
      std::_Vector_base<trng::GF2,_std::allocator<trng::GF2>_>::~_Vector_base
                ((_Vector_base<trng::GF2,_std::allocator<trng::GF2>_> *)&local_80);
    }
    status_type::to_vector((vector<trng::GF2,_256UL> *)&local_a8,&this->S);
    power<trng::GF2,256ul>
              ((matrix<trng::GF2,_256UL> *)&local_48,(trng *)&local_60,(matrix<trng::GF2,_256UL> *)s
               ,in_RCX);
    f.b = (vector<trng::GF2,_256UL> *)&local_a8;
    f.a = (matrix<trng::GF2,_256UL> *)&local_48;
    vector<trng::GF2,256ul>::operator*((vector<trng::GF2,256ul> *)&local_80,f);
    std::_Vector_base<trng::GF2,_std::allocator<trng::GF2>_>::~_Vector_base(&local_48);
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      rVar3 = 0;
      for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
        rVar3 = (ulong)(*(char *)(local_80.r[0] + lVar5) != '\0') + rVar3 * 2;
      }
      (this->S).r[lVar1] = rVar3;
      local_80.r[0] = local_80.r[0] + 0x40;
    }
    std::_Vector_base<trng::GF2,_std::allocator<trng::GF2>_>::~_Vector_base
              ((_Vector_base<trng::GF2,_std::allocator<trng::GF2>_> *)&local_80);
    std::_Vector_base<trng::GF2,_std::allocator<trng::GF2>_>::~_Vector_base
              ((_Vector_base<trng::GF2,_std::allocator<trng::GF2>_> *)&local_a8);
    std::_Vector_base<trng::GF2,_std::allocator<trng::GF2>_>::~_Vector_base(&local_60);
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void xoshiro256plus::jump(unsigned long long s) {
    if (s < 16) {
      for (unsigned int i{0}; i < s; ++i)
        step();
    } else {
      matrix<GF2, 256> M;
      for (int i{0}; i < 256; ++i) {
        xoshiro256plus R;
        R.S = status_type(i, status_type::eye{});
        R.step();
        const vector<GF2, 256> v{R.S.to_vector()};
        for (int j{0}; j < 256; ++j)
          M(j, i) = v(j);
      }

      const vector<GF2, 256> v0{S.to_vector()};
      const vector<GF2, 256> v1{power(M, s) * v0};

      for (int j{0}; j < 4; ++j) {
        result_type r_j{0};
        for (int i{0}; i < 64; ++i) {
          r_j <<= 1;
          if (static_cast<bool>(v1(i + 64 * j)))
            r_j |= 1;
        }
        S.r[j] = r_j;
      }
    }
  }